

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void add_objsymbol(ObjectUnit *ou,Symbol *newsym)

{
  Symbol *pSVar1;
  char *__s1;
  uint uVar2;
  int iVar3;
  unsigned_long uVar4;
  Symbol *pSVar5;
  Symbol **ppSVar6;
  
  ppSVar6 = ou->objsyms;
  uVar4 = elf_hash(newsym->name);
  uVar2 = (uint)uVar4 & 0x1f;
  pSVar1 = ppSVar6[uVar2];
  if (pSVar1 == (Symbol *)0x0) {
    ppSVar6 = ppSVar6 + uVar2;
  }
  else {
    do {
      pSVar5 = pSVar1;
      __s1 = newsym->name;
      iVar3 = strcmp(__s1,pSVar5->name);
      if (iVar3 == 0) {
        ierror("add_objsymbol(): %s defined twice",__s1);
      }
      pSVar1 = pSVar5->obj_chain;
    } while (pSVar5->obj_chain != (Symbol *)0x0);
    ppSVar6 = &pSVar5->obj_chain;
  }
  *ppSVar6 = newsym;
  return;
}

Assistant:

static void add_objsymbol(struct ObjectUnit *ou,struct Symbol *newsym)
/* Add a symbol to an object unit's symbol table. The symbol name
   must be unique within the object, otherwise an internal error
   will occur! */
{
  struct Symbol *sym;
  struct Symbol **chain = &ou->objsyms[elf_hash(newsym->name)%OBJSYMHTABSIZE];

  while (sym = *chain) {
    if (!strcmp(newsym->name,sym->name))
      ierror("add_objsymbol(): %s defined twice",newsym->name);
    chain = &sym->obj_chain;
  }
  *chain = newsym;
}